

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O0

void __thiscall
ktx::OptionsTranscodeTarget<true>::process
          (OptionsTranscodeTarget<true> *this,Options *param_2,ParseResult *args,Reporter *report)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>
  __l;
  bool bVar1;
  int iVar2;
  OptionValue *pOVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined8 *in_RDI;
  const_iterator it;
  string argStr;
  char *argName;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
  *in_stack_fffffffffffffae8;
  optional<ktx_transcode_fmt_e> *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  hasher *in_stack_fffffffffffffb00;
  size_type in_stack_fffffffffffffb08;
  pair<ktx_transcode_fmt_e,_unsigned_int> *in_stack_fffffffffffffb10;
  iterator in_stack_fffffffffffffb18;
  ParseResult *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  allocator<char> *args_00;
  Reporter *in_stack_fffffffffffffb68;
  Reporter *local_488;
  undefined8 local_408;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
  local_400;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
  local_3f8;
  undefined1 local_3e9 [33];
  string local_3c8 [32];
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [33];
  undefined1 local_35f [55];
  ktx_transcode_fmt_e local_328;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_324;
  int local_31c [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_314;
  int local_30c [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_304;
  int local_2fc [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2f4;
  int local_2ec [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2e4;
  int local_2dc [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2d4;
  int local_2cc [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2c4;
  int local_2bc [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2b4;
  int local_2ac [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2a4;
  int local_29c [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_294 [2];
  int local_280 [2];
  pair<ktx_transcode_fmt_e,_unsigned_int> local_278;
  Reporter *local_270;
  Reporter local_268;
  undefined1 local_218 [40];
  undefined1 local_1f0 [40];
  undefined1 local_1c8 [40];
  undefined1 local_1a0 [40];
  undefined1 local_178 [40];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  undefined1 local_100 [40];
  undefined1 local_d8 [40];
  undefined1 local_b0 [40];
  undefined1 local_88 [40];
  undefined1 local_60 [40];
  Reporter *local_38;
  size_type local_30;
  char *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_28 = "target";
  local_18 = in_RDX;
  if ((process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::targets_abi_cxx11_ == '\0')
     && (iVar2 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)
                                      ::targets_abi_cxx11_), iVar2 != 0)) {
    local_270 = &local_268;
    local_280[1] = 0;
    local_280[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_278,(ktx_transcode_fmt_e *)(local_280 + 1),local_280);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [8])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)&local_268.commandDescription._M_string_length;
    local_29c[1] = 1;
    local_29c[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (local_294,(ktx_transcode_fmt_e *)(local_29c + 1),local_29c);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[9],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [9])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_218;
    local_2ac[1] = 0x14;
    local_2ac[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_2a4,(ktx_transcode_fmt_e *)(local_2ac + 1),local_2ac);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[8],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [8])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_1f0;
    local_2bc[1] = 0x15;
    local_2bc[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_2b4,(ktx_transcode_fmt_e *)(local_2bc + 1),local_2bc);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[9],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [9])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_1c8;
    local_2cc[1] = 2;
    local_2cc[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_2c4,(ktx_transcode_fmt_e *)(local_2cc + 1),local_2cc);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [4])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_1a0;
    local_2dc[1] = 3;
    local_2dc[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_2d4,(ktx_transcode_fmt_e *)(local_2dc + 1),local_2dc);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [4])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_178;
    local_2ec[1] = 4;
    local_2ec[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_2e4,(ktx_transcode_fmt_e *)(local_2ec + 1),local_2ec);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [4])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_150;
    local_2fc[1] = 5;
    local_2fc[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_2f4,(ktx_transcode_fmt_e *)(local_2fc + 1),local_2fc);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [4])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_128;
    local_30c[1] = 6;
    local_30c[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_304,(ktx_transcode_fmt_e *)(local_30c + 1),local_30c);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [4])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_100;
    local_31c[1] = 10;
    local_31c[0] = 0;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_314,(ktx_transcode_fmt_e *)(local_31c + 1),local_31c);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[5],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [5])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_d8;
    local_328 = KTX_TTF_RGBA32;
    local_35f._51_4_ = 1;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              (&local_324,&local_328,(int *)(local_35f + 0x33));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[3],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [3])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_b0;
    local_35f._39_4_ = 0xd;
    local_35f._35_4_ = 2;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              ((pair<ktx_transcode_fmt_e,_unsigned_int> *)(local_35f + 0x2b),
               (ktx_transcode_fmt_e *)(local_35f + 0x27),(int *)(local_35f + 0x23));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[4],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [4])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_88;
    local_35f._23_4_ = 0xd;
    local_35f._19_4_ = 3;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              ((pair<ktx_transcode_fmt_e,_unsigned_int> *)(local_35f + 0x1b),
               (ktx_transcode_fmt_e *)(local_35f + 0x17),(int *)(local_35f + 0x13));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[5],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [5])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_270 = (Reporter *)local_60;
    local_35f._7_4_ = 0xd;
    local_35f._3_4_ = 4;
    std::pair<ktx_transcode_fmt_e,_unsigned_int>::pair<ktx_transcode_fmt_e,_int,_true>
              ((pair<ktx_transcode_fmt_e,_unsigned_int> *)(local_35f + 0xb),
               (ktx_transcode_fmt_e *)(local_35f + 7),(int *)(local_35f + 3));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
    ::pair<const_char_(&)[6],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
                *)in_stack_fffffffffffffb20,(char (*) [6])in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    local_38 = &local_268;
    local_30 = 0xe;
    in_stack_fffffffffffffae8 =
         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
          *)local_35f;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>
                 *)0x2a5e8b);
    __l._M_len = (size_type)in_stack_fffffffffffffb20;
    __l._M_array = in_stack_fffffffffffffb18;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
                     *)in_stack_fffffffffffffb10,__l,in_stack_fffffffffffffb08,
                    in_stack_fffffffffffffb00,(key_equal *)in_stack_fffffffffffffaf8,
                    (allocator_type *)in_stack_fffffffffffffb30);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>
                  *)0x2a5ed8);
    local_488 = (Reporter *)&local_38;
    do {
      in_stack_fffffffffffffb68 = (Reporter *)((long)&local_488[-1].commandName.field_2 + 8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
               *)0x2a5f0f);
      local_488 = in_stack_fffffffffffffb68;
    } while (in_stack_fffffffffffffb68 != &local_268);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
                 ::~unordered_map,
                 &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                  targets_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                         targets_abi_cxx11_);
  }
  args_00 = &local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (allocator<char> *)in_stack_fffffffffffffb20);
  pOVar3 = cxxopts::ParseResult::operator[]
                     (in_stack_fffffffffffffb20,&in_stack_fffffffffffffb18->first);
  sVar4 = cxxopts::OptionValue::count(pOVar3);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator(&local_381);
  if (sVar4 != 0) {
    pOVar3 = (OptionValue *)local_3e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
               (allocator<char> *)in_stack_fffffffffffffb20);
    cxxopts::ParseResult::operator[](in_stack_fffffffffffffb20,&in_stack_fffffffffffffb18->first);
    pbVar5 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    std::__cxx11::string::string(local_3c8,(string *)pbVar5);
    to_lower_copy(in_stack_fffffffffffffaf8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string((string *)(local_3e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3e9);
    local_3f8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
         ::find(in_stack_fffffffffffffae8,(key_type *)0x2a60a7);
    local_400._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
         ::end(in_stack_fffffffffffffae8);
    bVar1 = std::__detail::operator==(&local_3f8,&local_400);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[32],std::__cxx11::string_const&>
                (in_stack_fffffffffffffb68,(char (*) [32])args_00,local_18);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_false,_true>
                  *)0x2a62c2);
    std::optional<ktx_transcode_fmt_e>::optional<const_ktx_transcode_fmt_e_&,_true>
              (in_stack_fffffffffffffaf0,(ktx_transcode_fmt_e *)in_stack_fffffffffffffae8);
    *in_RDI = local_408;
    std::__cxx11::string::operator=((string *)(in_RDI + 1),local_3a8);
    pvVar6 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_false,_true>
                           *)0x2a6309);
    *(uint *)(in_RDI + 5) = (pvVar6->second).second;
    std::__cxx11::string::~string(local_3a8);
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        // "transcode" command - optional "target" argument
        // "extract" command - optional "transcode" argument
        const auto argName = TRANSCODE_CMD ? "target" : "transcode";

        static const std::unordered_map<std::string, std::pair<ktx_transcode_fmt_e, uint32_t>> targets{
            {"etc-rgb", {KTX_TTF_ETC1_RGB, 0}},
            {"etc-rgba", {KTX_TTF_ETC2_RGBA, 0}},
            {"eac-r11", {KTX_TTF_ETC2_EAC_R11, 0}},
            {"eac-rg11", {KTX_TTF_ETC2_EAC_RG11, 0}},
            {"bc1", {KTX_TTF_BC1_RGB, 0}},
            {"bc3", {KTX_TTF_BC3_RGBA, 0}},
            {"bc4", {KTX_TTF_BC4_R, 0}},
            {"bc5", {KTX_TTF_BC5_RG, 0}},
            {"bc7", {KTX_TTF_BC7_RGBA, 0}},
            {"astc", {KTX_TTF_ASTC_4x4_RGBA, 0}},
            {"r8", {KTX_TTF_RGBA32, 1}},
            {"rg8", {KTX_TTF_RGBA32, 2}},
            {"rgb8", {KTX_TTF_RGBA32, 3}},
            {"rgba8", {KTX_TTF_RGBA32, 4}},
        };
        if (args[argName].count()) {
            const auto argStr = to_lower_copy(args[argName].as<std::string>());
            const auto it = targets.find(argStr);
            if (it == targets.end())
                report.fatal_usage("Invalid transcode target: \"{}\".", argStr);

            transcodeTarget = it->second.first;
            transcodeTargetName = argStr;
            transcodeSwizzleComponents = it->second.second;
        }
    }